

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

ArrayPtr<const_unsigned_char> * __thiscall
kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,
          ArrayPtr<const_unsigned_char> *row)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar2;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar3;
  size_t sVar4;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table;
  char local_28;
  
  pAVar1 = (this->rows).builder.ptr;
  sVar4 = (long)(this->rows).builder.pos - (long)pAVar1 >> 4;
  table.size_ = (size_t)pAVar1;
  table.ptr = (ArrayPtr<const_unsigned_char> *)&this->indexes;
  HashIndex<kj::_::HashSetCallbacks>::
  insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&local_28,table,sVar4,
             (ArrayPtr<const_unsigned_char> *)sVar4);
  if (local_28 != '\x01') {
    pRVar3 = (this->rows).builder.pos;
    if (pRVar3 == (this->rows).builder.endPtr) {
      pRVar2 = (this->rows).builder.ptr;
      sVar4 = 4;
      if (pRVar3 != pRVar2) {
        sVar4 = (long)pRVar3 - (long)pRVar2 >> 3;
      }
      Vector<kj::ArrayPtr<const_unsigned_char>_>::setCapacity(&this->rows,sVar4);
      pRVar3 = (this->rows).builder.pos;
    }
    sVar4 = row->size_;
    pRVar3->ptr = row->ptr;
    pRVar3->size_ = sVar4;
    pAVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pAVar1 + 1;
    return pAVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }